

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O0

void __thiscall
ktx::ValidationContext::error<std::__cxx11::string>
          (ValidationContext *this,IssueError *issue,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  basic_string_view<char,_std::char_traits<char>_> s;
  underlying_type_t<ktx::ReturnCode> uVar1;
  allocator<char> *__a;
  undefined8 in_RDX;
  ValidationReport *extraout_RDX;
  undefined1 *in_RSI;
  long in_RDI;
  undefined1 in_stack_000000d8 [16];
  undefined1 in_stack_000000e8 [16];
  ValidationReport *in_stack_fffffffffffffe68;
  basic_string_view<char> *in_stack_fffffffffffffe70;
  ValidationReport *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *__t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string_view<char,_std::char_traits<char>_> local_129 [2];
  char acStack_100 [32];
  undefined8 local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8 [3];
  undefined8 local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_a8;
  undefined8 local_90;
  undefined1 local_88 [16];
  char *local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_38;
  undefined8 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_28;
  undefined8 local_20;
  undefined8 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  **local_10;
  undefined8 *local_8;
  
  *(int *)(in_RDI + 0x30) = *(int *)(in_RDI + 0x30) + 1;
  local_e0 = in_RDX;
  local_d8 = in_RSI;
  uVar1 = ktx::operator+(SUCCESS);
  *(underlying_type_t<ktx::ReturnCode> *)(in_RDI + 0x2c) = uVar1;
  local_129[0]._M_len._1_1_ = *local_d8;
  local_129[0]._M_len._3_2_ = *(undefined2 *)(local_d8 + 2);
  __a = (allocator<char> *)(local_d8 + 8);
  __t = local_129;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_fffffffffffffeb0,__t,__a);
  pcVar2 = acStack_100;
  local_60 = (undefined8 *)(local_d8 + 0x18);
  local_58 = &stack0xfffffffffffffeb0;
  local_70 = *local_60;
  local_68 = *(undefined8 *)(local_d8 + 0x20);
  s._M_str = pcVar2;
  s._M_len = (size_t)in_stack_fffffffffffffe78;
  ::fmt::v10::basic_string_view<char>::
  basic_string_view<std::basic_string_view<char,_std::char_traits<char>_>,_0>
            (in_stack_fffffffffffffe70,s);
  local_8 = local_60;
  local_90 = local_e0;
  local_50 = local_88;
  local_78 = pcVar2;
  local_c8[0] = ::fmt::v10::
                make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string>
                          (in_stack_fffffffffffffe78);
  local_30 = &local_b0;
  local_38 = local_c8;
  local_20 = 0xd;
  local_b0 = 0xd;
  this_00 = extraout_RDX;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_a8 = local_38;
  ::fmt::v10::vformat_abi_cxx11_((string_view)in_stack_000000e8,(format_args)in_stack_000000d8);
  std::function<void_(const_ktx::ValidationReport_&)>::operator()
            ((function<void_(const_ktx::ValidationReport_&)> *)this_00,in_stack_fffffffffffffe68);
  ValidationReport::~ValidationReport(this_00);
  std::allocator<char>::~allocator((allocator<char> *)local_129);
  return;
}

Assistant:

void error(const IssueError& issue, Args&&... args) {
        ++numError;
        returnCode = +rc::INVALID_FILE;
        callback(ValidationReport{issue.type, issue.id, std::string{issue.message}, fmt::format(issue.detailsFmt, std::forward<Args>(args)...)});
    }